

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin-cursor.c
# Opt level: O1

int coda_bin_cursor_read_string(coda_cursor *cursor,char *dst,long dst_size)

{
  int64_t bit_offset;
  bool bVar1;
  int iVar2;
  coda_type *pcVar3;
  ulong uVar4;
  int64_t bit_size;
  char s2 [21];
  char s1 [21];
  ulong local_70;
  char local_68 [32];
  char local_48 [24];
  
  pcVar3 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar3->format) {
    pcVar3 = *(coda_type **)&pcVar3->type_class;
  }
  bit_offset = cursor->stack[(long)cursor->n + -1].bit_offset;
  if (-1 < pcVar3->bit_size) {
    local_70 = (ulong)pcVar3->bit_size >> 3;
    goto LAB_0011ea2f;
  }
  iVar2 = coda_bin_cursor_get_bit_size(cursor,(int64_t *)&local_70);
  if (iVar2 == 0) {
    if ((long)local_70 < 0) {
      coda_str64(local_70,local_48);
      coda_str64(cursor->stack[(long)cursor->n + -1].bit_offset >> 3,local_68);
      coda_set_error(-300,
                     "possible product error detected (invalid bit size (%s) for binary string - byte:bit offset = %s:%d)"
                     ,local_48,local_68,
                     (ulong)((uint)cursor->stack[(long)cursor->n + -1].bit_offset & 7));
      goto LAB_0011ea24;
    }
    if ((local_70 & 7) != 0) {
      coda_set_error(-300,"product error detected (text does not have a rounded byte size)");
      goto LAB_0011ea24;
    }
    local_70 = local_70 >> 3;
    bVar1 = true;
  }
  else {
LAB_0011ea24:
    local_70 = 0;
    bVar1 = false;
  }
  if (!bVar1) {
    return -1;
  }
LAB_0011ea2f:
  uVar4 = dst_size - 1;
  if ((long)local_70 < dst_size) {
    uVar4 = local_70;
  }
  if (0 < (long)uVar4) {
    iVar2 = read_bits(cursor->product,bit_offset,uVar4 * 8,(uint8_t *)dst);
    if (iVar2 != 0) {
      return -1;
    }
    dst = dst + uVar4;
  }
  *dst = '\0';
  return 0;
}

Assistant:

int coda_bin_cursor_read_string(const coda_cursor *cursor, char *dst, long dst_size)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    int64_t bit_offset = cursor->stack[cursor->n - 1].bit_offset;
    int64_t read_size = 0;

    if (type->bit_size < 0)
    {
        int64_t bit_size;

        if (coda_bin_cursor_get_bit_size(cursor, &bit_size) != 0)
        {
            return -1;
        }
        if (bit_size < 0)
        {
            char s1[21];
            char s2[21];

            coda_str64(bit_size, s1);
            coda_str64(cursor->stack[cursor->n - 1].bit_offset >> 3, s2);
            coda_set_error(CODA_ERROR_PRODUCT,
                           "possible product error detected (invalid bit size (%s) for binary string - "
                           "byte:bit offset = %s:%d)", s1, s2, (int)(cursor->stack[cursor->n - 1].bit_offset & 0x7));
            return -1;
        }
        if ((bit_size & 0x7) != 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "product error detected (text does not have a rounded byte size)");
            return -1;
        }
        read_size = bit_size >> 3;
    }
    else
    {
        read_size = type->bit_size >> 3;
    }
    if (read_size + 1 > dst_size)       /* account for terminating zero */
    {
        read_size = dst_size - 1;
    }
    if (read_size > 0)
    {
        if (read_bits(cursor->product, bit_offset, 8 * read_size, (uint8_t *)dst) != 0)
        {
            return -1;
        }
        dst[read_size] = '\0';
    }
    else
    {
        dst[0] = '\0';
    }

    return 0;
}